

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::file_renamed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_renamed_alert *this)

{
  uint uVar1;
  char local_e8 [8];
  char msg [200];
  file_renamed_alert *this_local;
  string *ret;
  
  msg[199] = '\0';
  torrent_alert::message_abi_cxx11_(__return_storage_ptr__,&this->super_torrent_alert);
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&this->index);
  snprintf(local_e8,200,": file %d renamed to ",(ulong)uVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  new_name(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string file_renamed_alert::message() const
	{
		std::string ret { torrent_alert::message() };
		char msg[200];
		std::snprintf(msg, sizeof(msg), ": file %d renamed to "
			, static_cast<int>(index));
		ret.append(msg);
		ret.append(new_name());
		return ret;
	}